

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_30852::TestExceptionsInFixtureAreReportedAsHappeningInTheFixture::
~TestExceptionsInFixtureAreReportedAsHappeningInTheFixture
          (TestExceptionsInFixtureAreReportedAsHappeningInTheFixture *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST (ExceptionsInFixtureAreReportedAsHappeningInTheFixture)
{
    RecordingReporter reporter;
    TestResults result(&reporter);
	{
		ScopedCurrentTest scopedResults(result);
		list2.GetHead()->Run();
	}

    CHECK(strstr(reporter.lastFailedMessage, "xception"));
    CHECK(strstr(reporter.lastFailedMessage, "fixture"));
    CHECK(strstr(reporter.lastFailedMessage, "ThrowingThingie"));
}